

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2loop.cc
# Opt level: O1

void __thiscall S2Loop::S2Loop(S2Loop *this,S2Cell *cell)

{
  VType *pVVar1;
  S2Point *pSVar2;
  long lVar3;
  int i;
  long lVar4;
  S2Point local_48;
  
  (this->super_S2Region)._vptr_S2Region = (_func_int **)&PTR__S2Loop_002c2448;
  this->depth_ = 0;
  this->num_vertices_ = 4;
  pSVar2 = (S2Point *)operator_new__(0x60);
  pSVar2->c_[0] = 0.0;
  pSVar2->c_[1] = 0.0;
  pSVar2->c_[2] = 0.0;
  pSVar2[1].c_[0] = 0.0;
  pSVar2[1].c_[1] = 0.0;
  pSVar2[1].c_[2] = 0.0;
  pSVar2[2].c_[0] = 0.0;
  pSVar2[2].c_[1] = 0.0;
  pSVar2[2].c_[2] = 0.0;
  pSVar2[3].c_[0] = 0.0;
  pSVar2[3].c_[1] = 0.0;
  pSVar2[3].c_[2] = 0.0;
  this->vertices_ = pSVar2;
  this->owns_vertices_ = true;
  this->s2debug_override_ = ALLOW;
  this->origin_inside_ = false;
  (this->unindexed_contains_calls_).super___atomic_base<int>._M_i = 0;
  (this->bound_).super_S2Region._vptr_S2Region = (_func_int **)&PTR__S2Region_002c2078;
  (this->bound_).lat_.bounds_.c_[0] = 1.0;
  lVar3 = 0;
  (this->bound_).lat_.bounds_.c_[1] = 0.0;
  (this->bound_).lng_.bounds_.c_[0] = 3.141592653589793;
  (this->bound_).lng_.bounds_.c_[1] = -3.141592653589793;
  (this->subregion_bound_).super_S2Region._vptr_S2Region = (_func_int **)&PTR__S2Region_002c2078;
  (this->subregion_bound_).lat_.bounds_.c_[0] = 1.0;
  (this->subregion_bound_).lat_.bounds_.c_[1] = 0.0;
  (this->subregion_bound_).lng_.bounds_.c_[0] = 3.141592653589793;
  (this->subregion_bound_).lng_.bounds_.c_[1] = -3.141592653589793;
  MutableS2ShapeIndex::MutableS2ShapeIndex(&this->index_);
  lVar4 = 0;
  do {
    S2Cell::GetVertex(&local_48,cell,(int)lVar4);
    pSVar2 = this->vertices_;
    *(VType *)((long)pSVar2->c_ + lVar3 + 0x10) = local_48.c_[2];
    pVVar1 = (VType *)((long)pSVar2->c_ + lVar3);
    *pVVar1 = local_48.c_[0];
    pVVar1[1] = local_48.c_[1];
    lVar4 = lVar4 + 1;
    lVar3 = lVar3 + 0x18;
  } while (lVar4 != 4);
  InitOriginAndBound(this);
  return;
}

Assistant:

S2Loop::S2Loop(const S2Cell& cell)
    : depth_(0),
      num_vertices_(4),
      vertices_(new S2Point[num_vertices_]),
      owns_vertices_(true),
      s2debug_override_(S2Debug::ALLOW),
      unindexed_contains_calls_(0) {
  for (int i = 0; i < 4; ++i) {
    vertices_[i] = cell.GetVertex(i);
  }
  // We recompute the bounding rectangle ourselves, since S2Cell uses a
  // different method and we need all the bounds to be consistent.
  InitOriginAndBound();
}